

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O0

void __thiscall
Indexing::HashingClauseVariantIndex::~HashingClauseVariantIndex(HashingClauseVariantIndex *this)

{
  void *in_RDI;
  HashingClauseVariantIndex *in_stack_00000020;
  
  ~HashingClauseVariantIndex(in_stack_00000020);
  ::operator_delete(in_RDI,0x30);
  return;
}

Assistant:

HashingClauseVariantIndex::~HashingClauseVariantIndex()
{
  /*
  unsigned max = 0;
  ClauseList* maxval = 0;
  */

  DHMap<unsigned, ClauseList*>::Iterator iit(_entries);
  while(iit.hasNext()){
    ClauseList* lst = iit.next();

//    unsigned len = lst->length();
//
//    if (len > max) {
//      max = len;
//      maxval->destroy();
//      maxval = lst;
//    } else {
    ClauseList::destroy(lst);
//    }
  }

  /*
  cout << "max bucket of size " << max << endl;
  ClauseList::Iterator it(maxval);
  while (it.hasNext()) {
    Clause* cl = it.next();
    cout << cl->toString() << endl;
  }

  maxval->destroy();
  */
}